

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O2

int Ivy_CutFindOrAddFilter(Ivy_Store_t *pCutStore,Ivy_Cut_t *pCutNew)

{
  short sVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  short sVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int *piVar11;
  Ivy_Cut_t *pIVar12;
  
  if (pCutNew->uHash == 0) {
    __assert_fail("pCutNew->uHash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                  ,0x36d,"int Ivy_CutFindOrAddFilter(Ivy_Store_t *, Ivy_Cut_t *)");
  }
  piVar11 = pCutStore->pCuts[0].pArray;
  lVar9 = 0;
  do {
    iVar5 = pCutStore->nCuts;
    lVar6 = (long)iVar5;
    if (lVar6 <= lVar9) {
      if (pCutStore->nCutsMax <= iVar5) {
        __assert_fail("pCutStore->nCuts < pCutStore->nCutsMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                      ,0x396,"int Ivy_CutFindOrAddFilter(Ivy_Store_t *, Ivy_Cut_t *)");
      }
      pCutStore->nCuts = iVar5 + 1;
      pCutStore->pCuts[lVar6].uHash = pCutNew->uHash;
      iVar5 = pCutNew->nLatches;
      sVar1 = pCutNew->nSize;
      sVar4 = pCutNew->nSizeMax;
      uVar2 = *(undefined8 *)pCutNew->pArray;
      uVar3 = *(undefined8 *)(pCutNew->pArray + 4);
      piVar11 = pCutStore->pCuts[lVar6].pArray;
      *(undefined8 *)(piVar11 + 2) = *(undefined8 *)(pCutNew->pArray + 2);
      *(undefined8 *)(piVar11 + 4) = uVar3;
      pIVar12 = pCutStore->pCuts + lVar6;
      pIVar12->nLatches = iVar5;
      pIVar12->nSize = sVar1;
      pIVar12->nSizeMax = sVar4;
      *(undefined8 *)pIVar12->pArray = uVar2;
      return 0;
    }
    sVar1 = pCutStore->pCuts[lVar9].nSize;
    if (sVar1 != 0) {
      pIVar12 = pCutStore->pCuts + lVar9;
      if (sVar1 == pCutNew->nSize) {
        if (pIVar12->uHash == pCutNew->uHash) {
          uVar7 = 0;
          if (0 < sVar1) {
            uVar7 = (ulong)(uint)(int)sVar1;
          }
          for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
            if (piVar11[uVar8] != pCutNew->pArray[uVar8]) {
              uVar7 = uVar8 & 0xffffffff;
              break;
            }
          }
          if ((uint)uVar7 == (int)sVar1) {
            return 1;
          }
        }
      }
      else {
        uVar10 = pCutNew->uHash & pIVar12->uHash;
        if (sVar1 < pCutNew->nSize) {
          if ((uVar10 == pIVar12->uHash) &&
             (iVar5 = Ivy_CutCheckDominance(pIVar12,pCutNew), iVar5 != 0)) {
            return 1;
          }
        }
        else if ((uVar10 == pCutNew->uHash) &&
                (iVar5 = Ivy_CutCheckDominance(pCutNew,pIVar12), iVar5 != 0)) {
          pIVar12->nSize = 0;
        }
      }
    }
    lVar9 = lVar9 + 1;
    piVar11 = piVar11 + 9;
  } while( true );
}

Assistant:

int Ivy_CutFindOrAddFilter( Ivy_Store_t * pCutStore, Ivy_Cut_t * pCutNew )
{
    Ivy_Cut_t * pCut;
    int i, k;
    assert( pCutNew->uHash );
    // try to find the cut
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        if ( pCut->nSize == pCutNew->nSize )
        {
            if ( pCut->uHash == pCutNew->uHash )
            {
                for ( k = 0; k < pCutNew->nSize; k++ )
                    if ( pCut->pArray[k] != pCutNew->pArray[k] )
                        break;
                if ( k == pCutNew->nSize )
                    return 1;
            }
            continue;
        }
        if ( pCut->nSize < pCutNew->nSize )
        {
            // skip the non-contained cuts
            if ( (pCut->uHash & pCutNew->uHash) != pCut->uHash )
                continue;
            // check containment seriously
            if ( Ivy_CutCheckDominance( pCut, pCutNew ) )
                return 1;
            continue;
        }
        // check potential containment of other cut

        // skip the non-contained cuts
        if ( (pCut->uHash & pCutNew->uHash) != pCutNew->uHash )
            continue;
        // check containment seriously
        if ( Ivy_CutCheckDominance( pCutNew, pCut ) )
        {
            // remove the current cut
            pCut->nSize = 0;
        }
    }
    assert( pCutStore->nCuts < pCutStore->nCutsMax );
    // add the cut
    pCut = pCutStore->pCuts + pCutStore->nCuts++;
    *pCut = *pCutNew;
    return 0;
}